

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_PrintBold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  FString *other;
  VMValue *pVVar1;
  char *pcVar2;
  bool bVar3;
  float floatval;
  FFont *local_b0;
  bool local_73;
  FString local_70;
  FString formatted;
  FFont *font;
  FName local_58;
  float saved;
  FName fontname;
  double local_48;
  double time;
  FString text;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc64,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc64,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  text.Chars = *(char **)&param->field_0;
  local_73 = true;
  if ((DObject *)text.Chars != (DObject *)0x0) {
    local_73 = DObject::IsKindOf((DObject *)text.Chars,AActor::RegistrationInfo.MyClass);
  }
  if (local_73 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc64,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc65,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x02') {
    __assert_fail("param[paramnum].Type == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc65,
                  "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = VMValue::s(param + 1);
  FString::FString((FString *)&time,other);
  if (numparam < 3) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc66,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    local_48 = (pVVar1->field_0).f;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc66,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    local_48 = param[2].field_0.f;
  }
  FName::FName(&local_58);
  if (numparam < 4) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc67,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    FName::operator=(&local_58,(pVVar1->field_0).i);
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc67,
                    "int AF_AActor_A_PrintBold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    FName::operator=(&local_58,param[3].field_0.i);
  }
  floatval = FFloatCVar::operator_cast_to_float(&con_midtime);
  formatted.Chars = (char *)0x0;
  pcVar2 = FString::operator[]((FString *)&time,0);
  if (*pcVar2 == '$') {
    pcVar2 = FString::operator[]((FString *)&time,1);
    pcVar2 = FStringTable::operator()(&GStrings,pcVar2);
    FString::operator=((FString *)&time,pcVar2);
  }
  bVar3 = FName::operator!=(&local_58,NAME_None);
  if (bVar3) {
    pcVar2 = FName::operator_cast_to_char_(&local_58);
    formatted.Chars = (char *)V_GetFont(pcVar2);
  }
  if (0.0 < local_48) {
    FFloatCVar::operator=(&con_midtime,(float)local_48);
  }
  FString::operator_cast_to_char_((FString *)&time);
  strbin1((char *)&local_70);
  if (formatted.Chars == (char *)0x0) {
    local_b0 = SmallFont;
  }
  else {
    local_b0 = (FFont *)formatted.Chars;
  }
  pcVar2 = FString::GetChars(&local_70);
  C_MidPrintBold(local_b0,pcVar2);
  FFloatCVar::operator=(&con_midtime,floatval);
  FString::~FString(&local_70);
  FString::~FString((FString *)&time);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PrintBold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(text);
	PARAM_FLOAT_DEF	(time);
	PARAM_NAME_DEF	(fontname);

	float saved = con_midtime;
	FFont *font = NULL;
	
	if (text[0] == '$') text = GStrings(&text[1]);
	if (fontname != NAME_None)
	{
		font = V_GetFont(fontname);
	}
	if (time > 0)
	{
		con_midtime = float(time);
	}
	FString formatted = strbin1(text);
	C_MidPrintBold(font != NULL ? font : SmallFont, formatted.GetChars());
	con_midtime = saved;
	return 0;
}